

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

string * despot::lower(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  int local_38;
  int i;
  locale local_20 [8];
  locale loc;
  string *str_local;
  string *copy;
  
  _loc = str;
  std::locale::locale(local_20);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  for (local_38 = 0; uVar2 = std::__cxx11::string::length(), (ulong)(long)local_38 < uVar2;
      local_38 = local_38 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    cVar1 = std::tolower<char>(*pcVar3,local_20);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pcVar3 = cVar1;
  }
  std::locale::~locale(local_20);
  return __return_storage_ptr__;
}

Assistant:

inline std::string lower(std::string str) {
  std::locale loc;
	std::string copy = str;
	for (int i = 0; i < copy.length(); i++)
		copy[i] = std::tolower(copy[i], loc);
	return copy;
}